

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_synthesis.c
# Opt level: O0

void dealloc_arrays(aom_film_grain_t *params,int ***pred_pos_luma,int ***pred_pos_chroma,
                   int **luma_grain_block,int **cb_grain_block,int **cr_grain_block,int **y_line_buf
                   ,int **cb_line_buf,int **cr_line_buf,int **y_col_buf,int **cb_col_buf,
                   int **cr_col_buf)

{
  int iVar1;
  undefined8 *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  int row_1;
  int row;
  int num_pos_chroma;
  int num_pos_luma;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined4 local_38;
  
  iVar1 = *(int *)(in_RDI + 0x128) * 2 * (*(int *)(in_RDI + 0x128) + 1);
  local_38 = iVar1;
  if (0 < *(int *)(in_RDI + 0x78)) {
    local_38 = iVar1 + 1;
  }
  if (*in_RSI != 0) {
    for (in_stack_ffffffffffffffc4 = 0; in_stack_ffffffffffffffc4 < iVar1;
        in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 + 1) {
      aom_free((void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    }
    aom_free((void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    *in_RSI = 0;
  }
  if (*in_RDX != 0) {
    for (in_stack_ffffffffffffffc0 = 0; in_stack_ffffffffffffffc0 < local_38;
        in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0 + 1) {
      aom_free((void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    }
    aom_free((void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    *in_RDX = 0;
  }
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  *_row_1 = 0;
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  *_num_pos_chroma = 0;
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  *cr_grain_block = (int *)0x0;
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  *cb_grain_block = (int *)0x0;
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  *luma_grain_block = (int *)0x0;
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  *pred_pos_chroma = (int **)0x0;
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  *in_RCX = 0;
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  *in_R8 = 0;
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  *in_R9 = 0;
  return;
}

Assistant:

static void dealloc_arrays(const aom_film_grain_t *params, int ***pred_pos_luma,
                           int ***pred_pos_chroma, int **luma_grain_block,
                           int **cb_grain_block, int **cr_grain_block,
                           int **y_line_buf, int **cb_line_buf,
                           int **cr_line_buf, int **y_col_buf, int **cb_col_buf,
                           int **cr_col_buf) {
  int num_pos_luma = 2 * params->ar_coeff_lag * (params->ar_coeff_lag + 1);
  int num_pos_chroma = num_pos_luma;
  if (params->num_y_points > 0) ++num_pos_chroma;

  if (*pred_pos_luma) {
    for (int row = 0; row < num_pos_luma; row++) {
      aom_free((*pred_pos_luma)[row]);
    }
    aom_free(*pred_pos_luma);
    *pred_pos_luma = NULL;
  }

  if (*pred_pos_chroma) {
    for (int row = 0; row < num_pos_chroma; row++) {
      aom_free((*pred_pos_chroma)[row]);
    }
    aom_free(*pred_pos_chroma);
    *pred_pos_chroma = NULL;
  }

  aom_free(*y_line_buf);
  *y_line_buf = NULL;

  aom_free(*cb_line_buf);
  *cb_line_buf = NULL;

  aom_free(*cr_line_buf);
  *cr_line_buf = NULL;

  aom_free(*y_col_buf);
  *y_col_buf = NULL;

  aom_free(*cb_col_buf);
  *cb_col_buf = NULL;

  aom_free(*cr_col_buf);
  *cr_col_buf = NULL;

  aom_free(*luma_grain_block);
  *luma_grain_block = NULL;

  aom_free(*cb_grain_block);
  *cb_grain_block = NULL;

  aom_free(*cr_grain_block);
  *cr_grain_block = NULL;
}